

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O2

void __thiscall
Nova::Simplex_Mesh<3>::Find_And_Append_Adjacent_Elements
          (Simplex_Mesh<3> *this,int simplex,Vector<int,_2,_true> *face)

{
  int i;
  bool bVar1;
  int in_EAX;
  Array<int> *pAVar2;
  int *piVar3;
  size_t t;
  ulong uVar4;
  int simplex2;
  Vector<int,_1,_true> ret;
  int local_38;
  Vector<int,_1,_true> local_34;
  
  i = (face->_data)._M_elems[0];
  local_34._data._M_elems[0] = (T_STORAGE)(face->_data)._M_elems[1];
  uVar4 = 0;
  local_38 = in_EAX;
  while( true ) {
    pAVar2 = Array<Nova::Array<int>_>::operator()(this->incident_elements,i);
    if ((ulong)((long)(pAVar2->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pAVar2->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar4) break;
    pAVar2 = Array<Nova::Array<int>_>::operator()(this->incident_elements,i);
    piVar3 = Array<int>::operator()(pAVar2,(int)uVar4);
    local_38 = *piVar3;
    if (local_38 != simplex) {
      bVar1 = Nodes_In_Simplex<1>(this,&local_34,local_38);
      if (bVar1) {
        pAVar2 = Array<Nova::Array<int>_>::operator()(this->adjacent_elements,simplex);
        Array<int>::Append_Unique(pAVar2,&local_38);
      }
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Find_And_Append_Adjacent_Elements(const int simplex,const Vector<int,d-1>& face)
{
    int first_node=face(0);Vector<int,d-2> other_nodes=face.Remove_Index(0);
    for(size_t t=0;t<(*incident_elements)(first_node).size();++t){
        int simplex2=(*incident_elements)(first_node)(t);
        if(simplex2!=simplex && Nodes_In_Simplex(other_nodes,simplex2))
            (*adjacent_elements)(simplex).Append_Unique(simplex2);}
}